

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::AssertionHandler::handleExpr<FIX::GapFillFlag&>
          (AssertionHandler *this,ExprLhs<FIX::GapFillFlag_&> *expr)

{
  UnaryExpr<FIX::GapFillFlag_&> local_30;
  ExprLhs<FIX::GapFillFlag_&> *local_18;
  ExprLhs<FIX::GapFillFlag_&> *expr_local;
  AssertionHandler *this_local;
  
  local_18 = expr;
  expr_local = (ExprLhs<FIX::GapFillFlag_&> *)this;
  ExprLhs<FIX::GapFillFlag_&>::makeUnaryExpr(&local_30,expr);
  handleExpr(this,&local_30.super_ITransientExpression);
  UnaryExpr<FIX::GapFillFlag_&>::~UnaryExpr(&local_30);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }